

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
eglu::getExtensions_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,eglu *this,Library *egl,EGLDisplay display)

{
  char *__s;
  deUint32 err;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *extensionStr;
  EGLDisplay display_local;
  Library *egl_local;
  
  extensionStr = (char *)egl;
  display_local = this;
  egl_local = (Library *)__return_storage_ptr__;
  local_28 = (char *)(**(code **)(*(long *)this + 0x150))(this,egl,0x3055);
  err = (**(code **)(*display_local + 0xf8))();
  checkError(err,"Querying extensions failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x4b);
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  de::splitString(__return_storage_ptr__,&local_48,' ');
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

vector<string> getExtensions (const Library& egl, EGLDisplay display)
{
	const char*	const extensionStr = egl.queryString(display, EGL_EXTENSIONS);

	EGLU_CHECK_MSG(egl, "Querying extensions failed");

	return de::splitString(extensionStr, ' ');
}